

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

CodeGeneratorResponse_File *
google::protobuf::Arena::
CreateMessageInternal<google::protobuf::compiler::CodeGeneratorResponse_File>(Arena *arena)

{
  CodeGeneratorResponse_File *pCVar1;
  
  if (arena == (Arena *)0x0) {
    pCVar1 = (CodeGeneratorResponse_File *)operator_new(0x38);
    (pCVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  }
  else {
    pCVar1 = (CodeGeneratorResponse_File *)
             AllocateAlignedWithHook
                       (arena,0x38,(type_info *)&compiler::CodeGeneratorResponse_File::typeinfo);
    (pCVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  }
  (pCVar1->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_004d10c0;
  pCVar1->_has_bits_ = (uint32_t  [1])0x0;
  pCVar1->_cached_size_ = (atomic<int>)0x0;
  (pCVar1->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (pCVar1->insertion_point_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (pCVar1->content_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  pCVar1->generated_code_info_ = (GeneratedCodeInfo *)0x0;
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }